

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

nng_err http_copy_data(nni_http_entity *entity,void *data,size_t size)

{
  char *pcVar1;
  nng_err nVar2;
  
  pcVar1 = (char *)nni_zalloc(size);
  if (pcVar1 == (char *)0x0) {
    nVar2 = NNG_ENOMEM;
  }
  else {
    if (entity->own == true) {
      nni_free(entity->data,entity->size);
    }
    entity->data = pcVar1;
    entity->size = size;
    entity->own = true;
    nVar2 = NNG_OK;
  }
  if (pcVar1 != (char *)0x0) {
    memcpy(entity->data,data,size);
  }
  return nVar2;
}

Assistant:

static nng_err
http_copy_data(nni_http_entity *entity, const void *data, size_t size)
{
	nng_err rv;
	if ((rv = http_alloc_data(entity, size)) == 0) {
		memcpy(entity->data, data, size);
	}
	return (rv);
}